

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O2

bool __thiscall util::fs::FileLock::wait_lock(FileLock *this,string *filename,int retries,int sleep)

{
  bool bVar1;
  
  while( true ) {
    if (retries < 1) {
      return true;
    }
    bVar1 = is_locked(this,filename);
    if (!bVar1) break;
    this = (FileLock *)(long)sleep;
    system::sleep(sleep);
    retries = retries + -1;
    if (retries == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool
FileLock::wait_lock (std::string const& filename, int retries, int sleep)
{
    while (retries > 0 && this->is_locked(filename))
    {
        system::sleep(sleep);
        retries -= 1;
        if (retries <= 0)
            return false;
    }
    return true;
}